

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  uchar uVar3;
  short sVar4;
  ushort uVar5;
  undefined2 uVar6;
  undefined8 uVar7;
  bool bVar8;
  byte bVar9;
  short sVar10;
  undefined1 auVar11 [8];
  stbi_uc sVar12;
  byte bVar13;
  int iVar14;
  stbi__uint32 sVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  stbi__jpeg *psVar20;
  byte *pbVar21;
  stbi_uc *psVar22;
  stbi_uc *psVar23;
  void *pvVar24;
  code *pcVar25;
  uchar *puVar26;
  uint uVar27;
  long lVar28;
  stbi_uc *psVar29;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  int iVar30;
  int iVar31;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int extraout_EDX_07;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar32;
  ulong extraout_RDX_02;
  long lVar33;
  long lVar34;
  stbi_uc *extraout_RDX_03;
  stbi_uc *psVar35;
  stbi_uc *extraout_RDX_04;
  stbi_uc *extraout_RDX_05;
  ulong uVar36;
  uchar *puVar37;
  byte *pbVar38;
  short sVar39;
  uint uVar40;
  stbi__context *psVar41;
  stbi__uint32 sVar42;
  ulong uVar43;
  short *psVar44;
  int iVar45;
  ushort *puVar46;
  uint uVar47;
  stbi__uint32 sVar48;
  ulong uVar49;
  int iVar50;
  int iVar51;
  int *piVar52;
  ulong uVar53;
  int *piVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 local_528 [8];
  short data [64];
  int local_f4;
  uint local_f0;
  undefined1 auStack_e8 [8];
  stbi_uc *coutput [4];
  uint local_bc;
  int local_9c;
  int local_78;
  ulong local_60;
  uint local_50;
  uint local_48;
  
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  psVar20 = (stbi__jpeg *)malloc(0x4888);
  psVar20->s = s;
  psVar20->idct_block_kernel = stbi__idct_simd;
  psVar20->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar20->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar20->jfif = 0;
  psVar20->app14_color_transform = -1;
  psVar20->marker = 0xff;
  sVar12 = stbi__get_marker(psVar20);
  if (sVar12 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar20);
  if (sVar12 == 0xd8) {
    psVar20 = (stbi__jpeg *)malloc(0x4888);
    psVar20->s = s;
    psVar20->idct_block_kernel = stbi__idct_simd;
    psVar20->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar20->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar20->img_comp[0].raw_data = (void *)0x0;
      psVar20->img_comp[0].raw_coeff = (void *)0x0;
      psVar20->img_comp[1].raw_data = (void *)0x0;
      psVar20->img_comp[1].raw_coeff = (void *)0x0;
      psVar20->img_comp[2].raw_data = (void *)0x0;
      psVar20->img_comp[2].raw_coeff = (void *)0x0;
      psVar20->img_comp[3].raw_data = (void *)0x0;
      psVar20->img_comp[3].raw_coeff = (void *)0x0;
      psVar20->restart_interval = 0;
      iVar14 = stbi__decode_jpeg_header(psVar20,0);
      uVar47 = extraout_EDX;
      if (iVar14 != 0) {
        paVar1 = psVar20->img_comp;
        bVar13 = stbi__get_marker(psVar20);
LAB_001220a1:
        if (bVar13 != 0xda) {
          uVar47 = (uint)bVar13;
          if (uVar47 == 0xdc) {
            iVar14 = stbi__get16be(psVar20->s);
            sVar15 = stbi__get16be(psVar20->s);
            paVar32 = extraout_RDX;
            if (iVar14 == 4) {
              if (sVar15 == psVar20->s->img_y) goto LAB_001220f7;
              stbi__g_failure_reason = "bad DNL height";
            }
            else {
              stbi__g_failure_reason = "bad DNL len";
            }
            goto LAB_00123f49;
          }
          if (uVar47 == 0xd9) {
            psVar41 = psVar20->s;
            uVar47 = psVar41->img_n;
            if (psVar20->progressive == 0) goto LAB_00123e6a;
            if ((int)uVar47 < 1) {
              uVar27 = req_comp + (uint)(req_comp == 0);
              bVar55 = false;
            }
            else {
              lVar34 = 0;
              do {
                iVar14 = psVar20->img_comp[lVar34].y + 7 >> 3;
                if (0 < iVar14) {
                  uVar47 = paVar1[lVar34].x + 7 >> 3;
                  iVar50 = 0;
                  do {
                    if (0 < (int)uVar47) {
                      uVar53 = 0;
                      do {
                        psVar44 = paVar1[lVar34].coeff +
                                  (paVar1[lVar34].coeff_w * iVar50 + (int)uVar53) * 0x40;
                        iVar45 = paVar1[lVar34].tq;
                        lVar28 = 0;
                        do {
                          psVar44[lVar28] = psVar44[lVar28] * psVar20->dequant[iVar45][lVar28];
                          lVar28 = lVar28 + 1;
                        } while (lVar28 != 0x40);
                        (*psVar20->idct_block_kernel)
                                  (paVar1[lVar34].data +
                                   uVar53 * 8 + (long)(iVar50 * 8 * paVar1[lVar34].w2),
                                   paVar1[lVar34].w2,psVar44);
                        uVar53 = uVar53 + 1;
                      } while (uVar53 != uVar47);
                    }
                    iVar50 = iVar50 + 1;
                  } while (iVar50 != iVar14);
                  psVar41 = psVar20->s;
                }
                lVar34 = lVar34 + 1;
                uVar47 = psVar41->img_n;
              } while (lVar34 < (int)uVar47);
LAB_00123e6a:
              uVar27 = (2 < (int)uVar47) + 1 + (uint)(2 < (int)uVar47);
              if (req_comp != 0) {
                uVar27 = req_comp;
              }
              uVar17 = uVar47;
              if (uVar47 == 3) {
                bVar55 = true;
                uVar47 = 3;
                if (psVar20->rgb != 3) {
                  uVar17 = 3;
                  if (psVar20->app14_color_transform != 0) goto LAB_00123ea3;
                  bVar55 = psVar20->jfif == 0;
                }
              }
              else {
LAB_00123ea3:
                uVar47 = uVar17;
                bVar55 = false;
              }
            }
            uVar17 = 1;
            if (bVar55) {
              uVar17 = uVar47;
            }
            if (uVar47 != 3) {
              uVar17 = uVar47;
            }
            if (2 < (int)uVar27) {
              uVar17 = uVar47;
            }
            coutput[1] = (stbi_uc *)0x0;
            coutput[2] = (stbi_uc *)0x0;
            auStack_e8 = (undefined1  [8])0x0;
            coutput[0] = (stbi_uc *)0x0;
            sVar15 = psVar41->img_x;
            if ((int)uVar17 < 1) {
LAB_00124d9a:
              sVar42 = psVar41->img_y;
              puVar26 = (uchar *)stbi__malloc_mad3(uVar27,sVar15,sVar42,1);
              iVar14 = (int)extraout_RDX_03;
              if (puVar26 != (uchar *)0x0) {
                if (sVar42 != 0) {
                  iVar50 = 0;
                  uVar47 = 0;
                  psVar35 = extraout_RDX_03;
                  do {
                    sVar15 = psVar41->img_x;
                    if (0 < (int)uVar17) {
                      piVar52 = (int *)(data + 0x10);
                      uVar53 = 0;
                      piVar54 = &psVar20->img_comp[0].y;
                      do {
                        iVar14 = piVar52[-1];
                        iVar45 = piVar52[-3];
                        iVar19 = iVar45 >> 1;
                        auVar56 = (**(code **)(piVar52 + -10))
                                            (*(stbi_uc **)(piVar54 + 10),
                                             *(undefined8 *)
                                              ((long)piVar52 +
                                              ((ulong)(iVar19 <= iVar14) << 3 | 0xffffffffffffffe0))
                                             ,*(undefined8 *)
                                               ((long)piVar52 +
                                               ((ulong)(iVar14 < iVar19) << 3 | 0xffffffffffffffe0))
                                             ,piVar52[-2],piVar52[-4]);
                        psVar35 = auVar56._8_8_;
                        coutput[uVar53 - 1] = auVar56._0_8_;
                        piVar52[-1] = iVar14 + 1;
                        if (iVar45 <= iVar14 + 1) {
                          piVar52[-1] = 0;
                          *(long *)(piVar52 + -8) = *(long *)(piVar52 + -6);
                          iVar14 = *piVar52;
                          *piVar52 = iVar14 + 1;
                          if (iVar14 + 1 < *piVar54) {
                            *(long *)(piVar52 + -6) = *(long *)(piVar52 + -6) + (long)piVar54[1];
                          }
                        }
                        uVar53 = uVar53 + 1;
                        piVar54 = piVar54 + 0x18;
                        piVar52 = piVar52 + 0xc;
                      } while (uVar17 != uVar53);
                    }
                    if ((int)uVar27 < 3) {
                      psVar41 = psVar20->s;
                      if (bVar55) {
                        if (uVar27 == 1) {
                          if (psVar41->img_x != 0) {
                            uVar53 = 0;
                            do {
                              bVar13 = coutput[1][uVar53];
                              puVar26[uVar53 + sVar15 * iVar50] =
                                   (uchar)((uint)bVar13 * 2 + ((uint)bVar13 + (uint)bVar13 * 8) * 3
                                           + (uint)coutput[0][uVar53] * 0x96 +
                                             (uint)*(byte *)((long)auStack_e8 + uVar53) * 0x4d >> 8)
                              ;
                              uVar53 = uVar53 + 1;
                              psVar35 = coutput[1];
                            } while (uVar53 < psVar41->img_x);
                          }
                        }
                        else if (psVar41->img_x != 0) {
                          uVar53 = 0;
                          do {
                            bVar13 = coutput[1][uVar53];
                            puVar26[uVar53 * 2 + (ulong)(sVar15 * iVar50)] =
                                 (uchar)((uint)bVar13 * 2 + ((uint)bVar13 + (uint)bVar13 * 8) * 3 +
                                         (uint)coutput[0][uVar53] * 0x96 +
                                         (uint)*(byte *)((long)auStack_e8 + uVar53) * 0x4d >> 8);
                            puVar26[uVar53 * 2 + (ulong)(sVar15 * iVar50) + 1] = 0xff;
                            uVar53 = uVar53 + 1;
                            psVar35 = coutput[1];
                          } while (uVar53 < psVar41->img_x);
                        }
                      }
                      else if (psVar41->img_n == 4) {
                        if (psVar20->app14_color_transform == 2) {
                          if (psVar41->img_x != 0) {
                            puVar37 = puVar26 + (ulong)(sVar15 * iVar50) + 1;
                            psVar35 = (stbi_uc *)0x0;
                            do {
                              iVar14 = (*(byte *)((long)auStack_e8 + (long)psVar35) ^ 0xff) *
                                       (uint)coutput[2][(long)psVar35];
                              puVar37[-1] = (uchar)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              *puVar37 = 0xff;
                              psVar35 = psVar35 + 1;
                              puVar37 = puVar37 + uVar27;
                            } while (psVar35 < (stbi_uc *)(ulong)psVar41->img_x);
                          }
                        }
                        else {
                          if (psVar20->app14_color_transform != 0) goto LAB_00125221;
                          if (psVar41->img_x != 0) {
                            puVar37 = puVar26 + (ulong)(sVar15 * iVar50) + 1;
                            uVar53 = 0;
                            do {
                              bVar13 = coutput[2][uVar53];
                              iVar14 = (uint)*(byte *)((long)auStack_e8 + uVar53) * (uint)bVar13;
                              iVar45 = (uint)coutput[0][uVar53] * (uint)bVar13;
                              puVar37[-1] = (uchar)((((uint)coutput[1][uVar53] * (uint)bVar13 + 0x80
                                                     >> 8) + (uint)coutput[1][uVar53] * (uint)bVar13
                                                     + 0x80 >> 8) * 0x1d +
                                                    (iVar45 + (iVar45 + 0x80U >> 8) + 0x80 >> 8) *
                                                    0x96 + (iVar14 + (iVar14 + 0x80U >> 8) + 0x80 >>
                                                           8) * 0x4d >> 8);
                              *puVar37 = 0xff;
                              uVar53 = uVar53 + 1;
                              puVar37 = puVar37 + uVar27;
                              psVar35 = coutput[0];
                            } while (uVar53 < psVar41->img_x);
                          }
                        }
                      }
                      else {
LAB_00125221:
                        if (uVar27 == 1) {
                          if (psVar41->img_x != 0) {
                            psVar29 = (stbi_uc *)0x0;
                            do {
                              (puVar26 + sVar15 * iVar50)[(long)psVar29] =
                                   *(uchar *)((long)auStack_e8 + (long)psVar29);
                              psVar29 = psVar29 + 1;
                              psVar35 = (stbi_uc *)(ulong)psVar41->img_x;
                            } while (psVar29 < (stbi_uc *)(ulong)psVar41->img_x);
                          }
                        }
                        else if (psVar41->img_x != 0) {
                          psVar29 = (stbi_uc *)0x0;
                          do {
                            puVar26[(long)psVar29 * 2 + (ulong)(sVar15 * iVar50)] =
                                 *(uchar *)((long)auStack_e8 + (long)psVar29);
                            puVar26[(long)psVar29 * 2 + (ulong)(sVar15 * iVar50) + 1] = 0xff;
                            psVar29 = psVar29 + 1;
                            psVar35 = (stbi_uc *)(ulong)psVar41->img_x;
                          } while (psVar29 < (stbi_uc *)(ulong)psVar41->img_x);
                        }
                      }
                    }
                    else {
                      psVar41 = psVar20->s;
                      if (psVar41->img_n == 3) {
                        if (bVar55) {
                          if (psVar41->img_x != 0) {
                            puVar37 = puVar26 + (ulong)(sVar15 * iVar50) + 3;
                            psVar35 = (stbi_uc *)0x0;
                            do {
                              puVar37[-3] = *(uchar *)((long)auStack_e8 + (long)psVar35);
                              puVar37[-2] = coutput[0][(long)psVar35];
                              puVar37[-1] = coutput[1][(long)psVar35];
                              *puVar37 = 0xff;
                              psVar35 = psVar35 + 1;
                              puVar37 = puVar37 + uVar27;
                            } while (psVar35 < (stbi_uc *)(ulong)psVar41->img_x);
                          }
                        }
                        else {
LAB_0012529e:
                          (*psVar20->YCbCr_to_RGB_kernel)
                                    (puVar26 + uVar47 * uVar27 * sVar15,(stbi_uc *)auStack_e8,
                                     coutput[0],coutput[1],psVar41->img_x,uVar27);
                          psVar41 = psVar20->s;
                          psVar35 = extraout_RDX_04;
                        }
                      }
                      else if (psVar41->img_n == 4) {
                        if (psVar20->app14_color_transform == 2) {
                          (*psVar20->YCbCr_to_RGB_kernel)
                                    (puVar26 + uVar47 * uVar27 * sVar15,(stbi_uc *)auStack_e8,
                                     coutput[0],coutput[1],psVar41->img_x,uVar27);
                          psVar41 = psVar20->s;
                          psVar35 = extraout_RDX_05;
                          if (psVar41->img_x != 0) {
                            pbVar38 = puVar26 + (ulong)(sVar15 * iVar50) + 2;
                            psVar29 = (stbi_uc *)0x0;
                            do {
                              bVar13 = coutput[2][(long)psVar29];
                              iVar14 = (pbVar38[-2] ^ 0xff) * (uint)bVar13;
                              pbVar38[-2] = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              iVar14 = (pbVar38[-1] ^ 0xff) * (uint)bVar13;
                              pbVar38[-1] = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              iVar14 = (*pbVar38 ^ 0xff) * (uint)bVar13;
                              *pbVar38 = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              psVar29 = psVar29 + 1;
                              pbVar38 = pbVar38 + uVar27;
                              psVar35 = (stbi_uc *)(ulong)psVar41->img_x;
                            } while (psVar29 < (stbi_uc *)(ulong)psVar41->img_x);
                          }
                        }
                        else {
                          if (psVar20->app14_color_transform != 0) goto LAB_0012529e;
                          if (psVar41->img_x != 0) {
                            puVar37 = puVar26 + (ulong)(sVar15 * iVar50) + 3;
                            uVar53 = 0;
                            do {
                              bVar13 = coutput[2][uVar53];
                              iVar14 = (uint)*(byte *)((long)auStack_e8 + uVar53) * (uint)bVar13;
                              puVar37[-3] = (uchar)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              iVar14 = (uint)coutput[0][uVar53] * (uint)bVar13;
                              puVar37[-2] = (uchar)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              puVar37[-1] = (uchar)(((uint)coutput[1][uVar53] * (uint)bVar13 + 0x80
                                                    >> 8) + (uint)coutput[1][uVar53] * (uint)bVar13
                                                    + 0x80 >> 8);
                              *puVar37 = 0xff;
                              uVar53 = uVar53 + 1;
                              puVar37 = puVar37 + uVar27;
                              psVar35 = coutput[1];
                            } while (uVar53 < psVar41->img_x);
                          }
                        }
                      }
                      else if (psVar41->img_x != 0) {
                        puVar37 = puVar26 + (ulong)(sVar15 * iVar50) + 3;
                        uVar53 = 0;
                        do {
                          uVar3 = *(uchar *)((long)auStack_e8 + uVar53);
                          puVar37[-1] = uVar3;
                          puVar37[-2] = uVar3;
                          puVar37[-3] = uVar3;
                          *puVar37 = 0xff;
                          uVar53 = uVar53 + 1;
                          puVar37 = puVar37 + uVar27;
                        } while (uVar53 < psVar41->img_x);
                      }
                    }
                    iVar14 = (int)psVar35;
                    uVar47 = uVar47 + 1;
                    iVar50 = iVar50 + uVar27;
                  } while (uVar47 < psVar41->img_y);
                  uVar47 = psVar41->img_n;
                }
                stbi__free_jpeg_components(psVar20,uVar47,iVar14);
                psVar41 = psVar20->s;
                *x = psVar41->img_x;
                *y = psVar41->img_y;
                if (comp != (int *)0x0) {
                  *comp = (uint)(2 < psVar41->img_n) * 2 + 1;
                }
                goto LAB_00123f65;
              }
            }
            else {
              lVar34 = 0;
              while( true ) {
                pvVar24 = malloc((ulong)(sVar15 + 3));
                *(void **)((long)&psVar20->img_comp[0].linebuf + lVar34 * 2) = pvVar24;
                iVar14 = extraout_EDX_07;
                if (pvVar24 == (void *)0x0) break;
                uVar53 = (long)psVar20->img_h_max /
                         (long)*(int *)((long)&psVar20->img_comp[0].h + lVar34 * 2);
                iVar14 = (int)uVar53;
                *(int *)((long)data + lVar34 + 0x10) = iVar14;
                iVar50 = psVar20->img_v_max / *(int *)((long)&psVar20->img_comp[0].v + lVar34 * 2);
                *(int *)((long)data + lVar34 + 0x14) = iVar50;
                *(int *)((long)data + lVar34 + 0x1c) = iVar50 >> 1;
                *(int *)((long)data + lVar34 + 0x18) =
                     (int)((ulong)((sVar15 - 1) + iVar14) / (uVar53 & 0xffffffff));
                *(undefined4 *)((long)data + lVar34 + 0x20) = 0;
                uVar7 = *(undefined8 *)((long)&psVar20->img_comp[0].data + lVar34 * 2);
                *(undefined8 *)((long)data + lVar34 + 8) = uVar7;
                *(undefined8 *)((long)data + lVar34) = uVar7;
                if (iVar14 == 2) {
                  pcVar25 = stbi__resample_row_h_2;
                  if (iVar50 != 1) {
                    if (iVar50 != 2) goto LAB_00124d7e;
                    pcVar25 = psVar20->resample_row_hv_2_kernel;
                  }
                }
                else if (iVar14 == 1) {
                  pcVar25 = stbi__resample_row_generic;
                  if (iVar50 == 2) {
                    pcVar25 = stbi__resample_row_v_2;
                  }
                  if (iVar50 == 1) {
                    pcVar25 = resample_row_1;
                  }
                }
                else {
LAB_00124d7e:
                  pcVar25 = stbi__resample_row_generic;
                }
                *(code **)((long)data + lVar34 + -8) = pcVar25;
                lVar34 = lVar34 + 0x30;
                if ((ulong)uVar17 * 0x30 == lVar34) goto LAB_00124d9a;
              }
            }
            stbi__free_jpeg_components(psVar20,uVar47,iVar14);
            stbi__g_failure_reason = "outofmem";
            goto LAB_00123f5f;
          }
          iVar14 = stbi__process_marker(psVar20,uVar47);
          uVar47 = extraout_EDX_00;
          if (iVar14 != 0) goto LAB_001220f7;
          goto LAB_00123f50;
        }
        iVar14 = stbi__get16be(psVar20->s);
        psVar41 = psVar20->s;
        pbVar38 = psVar41->img_buffer;
        paVar32 = extraout_RDX_00;
        if (pbVar38 < psVar41->img_buffer_end) {
          psVar41->img_buffer = pbVar38 + 1;
          bVar13 = *pbVar38;
LAB_00122189:
          uVar47 = (uint)bVar13;
          psVar20->scan_n = uVar47;
          if ((0xfb < (byte)(bVar13 - 5)) && (psVar41 = psVar20->s, (int)uVar47 <= psVar41->img_n))
          {
            if (iVar14 != uVar47 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              goto LAB_00123f49;
            }
            lVar34 = 0;
            do {
              pbVar21 = psVar41->img_buffer;
              pbVar38 = psVar41->img_buffer_end;
              if (pbVar21 < pbVar38) {
                psVar41->img_buffer = pbVar21 + 1;
                uVar27 = (uint)*pbVar21;
                pbVar21 = pbVar21 + 1;
              }
              else if (psVar41->read_from_callbacks == 0) {
                uVar27 = 0;
              }
              else {
                psVar35 = psVar41->buffer_start;
                iVar14 = (*(psVar41->io).read)
                                   (psVar41->io_user_data,(char *)psVar35,psVar41->buflen);
                if (iVar14 == 0) {
                  psVar41->read_from_callbacks = 0;
                  psVar29 = psVar41->buffer_start + 1;
                  psVar41->buffer_start[0] = '\0';
                  uVar27 = 0;
                }
                else {
                  psVar29 = psVar35 + iVar14;
                  uVar27 = (uint)*psVar35;
                }
                psVar41->img_buffer_end = psVar29;
                psVar41->img_buffer = psVar41->buffer_start + 1;
                psVar41 = psVar20->s;
                pbVar21 = psVar41->img_buffer;
                pbVar38 = psVar41->img_buffer_end;
              }
              if (pbVar21 < pbVar38) {
                psVar41->img_buffer = pbVar21 + 1;
                uVar17 = (uint)*pbVar21;
              }
              else if (psVar41->read_from_callbacks == 0) {
                uVar17 = 0;
              }
              else {
                psVar35 = psVar41->buffer_start;
                iVar14 = (*(psVar41->io).read)
                                   (psVar41->io_user_data,(char *)psVar35,psVar41->buflen);
                if (iVar14 == 0) {
                  psVar41->read_from_callbacks = 0;
                  psVar29 = psVar41->buffer_start + 1;
                  psVar41->buffer_start[0] = '\0';
                  uVar17 = 0;
                }
                else {
                  psVar29 = psVar35 + iVar14;
                  uVar17 = (uint)*psVar35;
                }
                psVar41->img_buffer_end = psVar29;
                psVar41->img_buffer = psVar41->buffer_start + 1;
                psVar41 = psVar20->s;
              }
              uVar47 = psVar41->img_n;
              if ((long)(int)uVar47 < 1) {
                uVar53 = 0;
              }
              else {
                uVar53 = 0;
                paVar32 = paVar1;
                while (paVar32->id != uVar27) {
                  uVar53 = uVar53 + 1;
                  paVar32 = paVar32 + 1;
                  if ((long)(int)uVar47 == uVar53) goto LAB_00123f50;
                }
              }
              if ((uint)uVar53 == uVar47) goto LAB_00123f50;
              uVar43 = uVar53 & 0xffffffff;
              paVar32 = (anon_struct_96_18_0d0905d3 *)(uVar43 * 0x60);
              psVar20->img_comp[uVar43].hd = uVar17 >> 4;
              if (0x3f < (byte)uVar17) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_00123f49;
              }
              paVar32 = paVar1 + uVar43;
              paVar32->ha = uVar17 & 0xf;
              if (3 < (uVar17 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_00123f49;
              }
              psVar20->order[lVar34] = (uint)uVar53;
              lVar34 = lVar34 + 1;
            } while (lVar34 < psVar20->scan_n);
            pbVar38 = psVar41->img_buffer;
            pbVar21 = psVar41->img_buffer_end;
            if (pbVar38 < pbVar21) {
              psVar41->img_buffer = pbVar38 + 1;
              bVar13 = *pbVar38;
              pbVar38 = pbVar38 + 1;
            }
            else if (psVar41->read_from_callbacks == 0) {
              bVar13 = 0;
            }
            else {
              psVar35 = psVar41->buffer_start;
              iVar14 = (*(psVar41->io).read)(psVar41->io_user_data,(char *)psVar35,psVar41->buflen);
              if (iVar14 == 0) {
                psVar41->read_from_callbacks = 0;
                psVar29 = psVar41->buffer_start + 1;
                psVar41->buffer_start[0] = '\0';
                bVar13 = 0;
              }
              else {
                psVar29 = psVar35 + iVar14;
                bVar13 = *psVar35;
              }
              psVar41->img_buffer_end = psVar29;
              psVar41->img_buffer = psVar41->buffer_start + 1;
              psVar41 = psVar20->s;
              pbVar38 = psVar41->img_buffer;
              pbVar21 = psVar41->img_buffer_end;
            }
            psVar20->spec_start = (uint)bVar13;
            if (pbVar38 < pbVar21) {
              psVar41->img_buffer = pbVar38 + 1;
              uVar47 = (uint)*pbVar38;
              pbVar38 = pbVar38 + 1;
            }
            else if (psVar41->read_from_callbacks == 0) {
              uVar47 = 0;
            }
            else {
              psVar35 = psVar41->buffer_start;
              iVar14 = (*(psVar41->io).read)(psVar41->io_user_data,(char *)psVar35,psVar41->buflen);
              if (iVar14 == 0) {
                psVar41->read_from_callbacks = 0;
                psVar29 = psVar41->buffer_start + 1;
                psVar41->buffer_start[0] = '\0';
                uVar47 = 0;
              }
              else {
                psVar29 = psVar35 + iVar14;
                uVar47 = (uint)*psVar35;
              }
              psVar41->img_buffer_end = psVar29;
              psVar41->img_buffer = psVar41->buffer_start + 1;
              psVar41 = psVar20->s;
              pbVar38 = psVar41->img_buffer;
              pbVar21 = psVar41->img_buffer_end;
            }
            psVar20->spec_end = uVar47;
            if (pbVar38 < pbVar21) {
              psVar41->img_buffer = pbVar38 + 1;
              uVar47 = (uint)*pbVar38;
            }
            else if (psVar41->read_from_callbacks == 0) {
              uVar47 = 0;
            }
            else {
              psVar35 = psVar41->buffer_start;
              iVar14 = (*(psVar41->io).read)(psVar41->io_user_data,(char *)psVar35,psVar41->buflen);
              if (iVar14 == 0) {
                psVar41->read_from_callbacks = 0;
                psVar29 = psVar41->buffer_start + 1;
                psVar41->buffer_start[0] = '\0';
                uVar47 = 0;
              }
              else {
                psVar29 = psVar35 + iVar14;
                uVar47 = (uint)*psVar35;
              }
              psVar41->img_buffer_end = psVar29;
              psVar41->img_buffer = psVar41->buffer_start + 1;
            }
            psVar20->succ_high = uVar47 >> 4;
            uVar27 = uVar47 & 0xf;
            paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar27;
            psVar20->succ_low = uVar27;
            iVar14 = psVar20->progressive;
            iVar50 = psVar20->spec_start;
            if (iVar14 == 0) {
              if (((iVar50 == 0) && ((byte)uVar47 < 0x10)) && (uVar27 == 0)) {
                psVar20->spec_end = 0x3f;
                goto LAB_00122542;
              }
            }
            else if (((iVar50 < 0x40) && (psVar20->spec_end < 0x40)) &&
                    ((iVar50 <= psVar20->spec_end && (((byte)uVar47 < 0xe0 && (uVar27 < 0xe)))))) {
LAB_00122542:
              uVar47 = psVar20->scan_n;
              uVar53 = (ulong)uVar47;
              iVar50 = psVar20->restart_interval;
              if (iVar50 == 0) {
                iVar50 = 0x7fffffff;
              }
              psVar20->code_buffer = 0;
              psVar20->code_bits = 0;
              psVar20->nomore = 0;
              psVar20->img_comp[3].dc_pred = 0;
              psVar20->img_comp[2].dc_pred = 0;
              psVar20->img_comp[1].dc_pred = 0;
              psVar20->img_comp[0].dc_pred = 0;
              psVar20->marker = 0xff;
              psVar20->todo = iVar50;
              psVar20->eob_run = 0;
              if (iVar14 == 0) {
                if (uVar47 == 1) {
                  iVar14 = psVar20->order[0];
                  iVar50 = psVar20->img_comp[iVar14].y + 7 >> 3;
                  bVar55 = true;
                  uVar47 = 1;
                  if (0 < iVar50) {
                    uVar27 = paVar1[iVar14].x + 7 >> 3;
                    iVar19 = 0;
                    iVar45 = 0;
                    do {
                      if (0 < (int)uVar27) {
                        lVar34 = 0;
                        do {
                          iVar31 = stbi__jpeg_decode_block
                                             (psVar20,(short *)local_528,
                                              psVar20->huff_dc + paVar1[iVar14].hd,
                                              psVar20->huff_ac + paVar1[iVar14].ha,
                                              psVar20->fast_ac[paVar1[iVar14].ha],iVar14,
                                              psVar20->dequant[paVar1[iVar14].tq]);
                          if (iVar31 == 0) {
                            bVar55 = false;
                            uVar47 = extraout_EDX_02;
                            goto LAB_001233d7;
                          }
                          (*psVar20->idct_block_kernel)
                                    (paVar1[iVar14].data + lVar34 + iVar19 * paVar1[iVar14].w2,
                                     paVar1[iVar14].w2,(short *)local_528);
                          uVar47 = (uint)extraout_RDX_02;
                          iVar31 = psVar20->todo;
                          psVar20->todo = iVar31 + -1;
                          uVar53 = extraout_RDX_02;
                          if (iVar31 < 2) {
                            if (psVar20->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar20);
                              uVar47 = extraout_EDX_03;
                            }
                            if ((psVar20->marker & 0xf8) != 0xd0) goto LAB_00122faf;
                            psVar20->code_buffer = 0;
                            psVar20->code_bits = 0;
                            psVar20->nomore = 0;
                            psVar20->img_comp[3].dc_pred = 0;
                            psVar20->img_comp[2].dc_pred = 0;
                            psVar20->img_comp[1].dc_pred = 0;
                            psVar20->img_comp[0].dc_pred = 0;
                            psVar20->marker = 0xff;
                            iVar31 = psVar20->restart_interval;
                            uVar53 = 0x7fffffff;
                            if (iVar31 == 0) {
                              iVar31 = 0x7fffffff;
                            }
                            psVar20->todo = iVar31;
                            psVar20->eob_run = 0;
                          }
                          lVar34 = lVar34 + 8;
                        } while ((ulong)uVar27 * 8 != lVar34);
                      }
                      uVar47 = (uint)uVar53;
                      iVar45 = iVar45 + 1;
                      iVar19 = iVar19 + 8;
                    } while (iVar45 != iVar50);
LAB_00122faf:
                    bVar55 = true;
                  }
                }
                else {
                  uVar47 = psVar20->img_mcu_y;
                  uVar53 = (ulong)uVar47;
                  bVar55 = true;
                  if (0 < (int)uVar47) {
                    iVar14 = psVar20->img_mcu_x;
                    iVar45 = 0;
                    do {
                      if (0 < iVar14) {
                        uVar27 = 0;
                        do {
                          iVar14 = psVar20->scan_n;
                          if (0 < iVar14) {
                            uVar53 = 0;
                            do {
                              iVar50 = psVar20->order[uVar53];
                              iVar19 = psVar20->img_comp[iVar50].v;
                              if (0 < iVar19) {
                                iVar14 = paVar1[iVar50].h;
                                iVar31 = 0;
                                do {
                                  if (0 < iVar14) {
                                    iVar19 = 0;
                                    do {
                                      iVar16 = paVar1[iVar50].v;
                                      iVar51 = stbi__jpeg_decode_block
                                                         (psVar20,(short *)local_528,
                                                          psVar20->huff_dc + paVar1[iVar50].hd,
                                                          psVar20->huff_ac + paVar1[iVar50].ha,
                                                          psVar20->fast_ac[paVar1[iVar50].ha],iVar50
                                                          ,psVar20->dequant[paVar1[iVar50].tq]);
                                      if (iVar51 == 0) {
                                        bVar55 = false;
                                        uVar47 = extraout_EDX_05;
                                        goto LAB_001233d7;
                                      }
                                      (*psVar20->idct_block_kernel)
                                                (paVar1[iVar50].data +
                                                 (long)(int)((iVar14 * uVar27 + iVar19) * 8) +
                                                 (long)((iVar16 * iVar45 + iVar31) *
                                                        paVar1[iVar50].w2 * 8),paVar1[iVar50].w2,
                                                 (short *)local_528);
                                      iVar19 = iVar19 + 1;
                                      iVar14 = paVar1[iVar50].h;
                                    } while (iVar19 < iVar14);
                                    iVar19 = paVar1[iVar50].v;
                                  }
                                  iVar31 = iVar31 + 1;
                                } while (iVar31 < iVar19);
                                iVar14 = psVar20->scan_n;
                              }
                              uVar53 = uVar53 + 1;
                            } while ((long)uVar53 < (long)iVar14);
                            iVar50 = psVar20->todo;
                          }
                          uVar47 = (uint)uVar53;
                          bVar55 = true;
                          psVar20->todo = iVar50 + -1;
                          bVar8 = iVar50 < 2;
                          iVar50 = iVar50 + -1;
                          if (bVar8) {
                            if (psVar20->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar20);
                              uVar47 = extraout_EDX_06;
                            }
                            if ((psVar20->marker & 0xf8) != 0xd0) goto LAB_001233d7;
                            psVar20->code_buffer = 0;
                            psVar20->code_bits = 0;
                            psVar20->nomore = 0;
                            psVar20->img_comp[3].dc_pred = 0;
                            psVar20->img_comp[2].dc_pred = 0;
                            psVar20->img_comp[1].dc_pred = 0;
                            psVar20->img_comp[0].dc_pred = 0;
                            psVar20->marker = 0xff;
                            iVar50 = psVar20->restart_interval;
                            if (iVar50 == 0) {
                              iVar50 = 0x7fffffff;
                            }
                            psVar20->todo = iVar50;
                            psVar20->eob_run = 0;
                          }
                          uVar27 = uVar27 + 1;
                          uVar53 = (ulong)uVar27;
                          iVar14 = psVar20->img_mcu_x;
                        } while ((int)uVar27 < iVar14);
                        uVar53 = (ulong)(uint)psVar20->img_mcu_y;
                      }
                      bVar55 = true;
                      iVar45 = iVar45 + 1;
                      uVar47 = (uint)uVar53;
                    } while (iVar45 < (int)uVar47);
                  }
                }
LAB_001233d7:
                if (!bVar55) goto LAB_00123f50;
              }
              else if (uVar47 == 1) {
                iVar14 = psVar20->order[0];
                iVar50 = psVar20->img_comp[iVar14].y + 7 >> 3;
                if (0 < iVar50) {
                  iVar19 = psVar20->img_comp[iVar14].x + 7 >> 3;
                  iVar45 = 0;
                  do {
                    if (0 < iVar19) {
                      iVar31 = 0;
                      do {
                        psVar44 = paVar1[iVar14].coeff +
                                  (paVar1[iVar14].coeff_w * iVar45 + iVar31) * 0x40;
                        uVar53 = (ulong)psVar20->spec_start;
                        if (uVar53 == 0) {
                          iVar16 = stbi__jpeg_decode_block_prog_dc
                                             (psVar20,psVar44,psVar20->huff_dc + paVar1[iVar14].hd,
                                              iVar14);
                          uVar47 = extraout_EDX_01;
                          if (iVar16 == 0) goto LAB_00123f50;
                        }
                        else {
                          iVar16 = paVar1[iVar14].ha;
                          iVar51 = psVar20->eob_run;
                          bVar13 = (byte)psVar20->succ_low;
                          if (psVar20->succ_high == 0) {
                            if (iVar51 == 0) {
                              paVar32 = (anon_struct_96_18_0d0905d3 *)
                                        (ulong)(uint)psVar20->code_bits;
                              do {
                                if ((int)paVar32 < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar20);
                                }
                                uVar47 = psVar20->code_buffer;
                                uVar43 = (ulong)(uVar47 >> 0x17);
                                sVar39 = psVar20->fast_ac[iVar16][uVar43];
                                uVar27 = (uint)sVar39;
                                iVar51 = (int)uVar53;
                                if (sVar39 == 0) {
                                  if (psVar20->code_bits < 0x10) {
                                    stbi__grow_buffer_unsafe(psVar20);
                                    uVar47 = psVar20->code_buffer;
                                    uVar43 = (ulong)(uVar47 >> 0x17);
                                  }
                                  uVar53 = (ulong)psVar20->huff_ac[iVar16].fast[uVar43];
                                  if (uVar53 == 0xff) {
                                    lVar34 = 0;
                                    do {
                                      lVar28 = lVar34;
                                      lVar34 = lVar28 + 1;
                                    } while (psVar20->huff_ac[iVar16].maxcode[lVar28 + 10] <=
                                             uVar47 >> 0x10);
                                    uVar27 = psVar20->code_bits;
                                    paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar27;
                                    if (lVar34 == 8) goto LAB_00125516;
                                    if ((int)uVar27 < (int)(lVar28 + 10)) goto LAB_00125520;
                                    uVar53 = (ulong)(int)((uVar47 >> (0x17U - (char)lVar34 & 0x1f) &
                                                          stbi__bmask[lVar28 + 10]) +
                                                         psVar20->huff_ac[iVar16].delta[lVar28 + 10]
                                                         );
                                    bVar2 = psVar20->huff_ac[iVar16].size[uVar53];
                                    if ((uVar47 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                        (uint)psVar20->huff_ac[iVar16].code[uVar53])
                                    goto LAB_00125635;
                                    uVar27 = (uVar27 - (int)lVar34) - 9;
                                    paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar27;
                                    psVar20->code_bits = uVar27;
                                    sVar15 = uVar47 << ((byte)(lVar28 + 10) & 0x1f);
                                    psVar20->code_buffer = sVar15;
                                  }
                                  else {
                                    bVar2 = psVar20->huff_ac[iVar16].size[uVar53];
                                    uVar27 = psVar20->code_bits - (uint)bVar2;
                                    paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar27;
                                    if (psVar20->code_bits < (int)(uint)bVar2) goto LAB_00125520;
                                    sVar15 = uVar47 << (bVar2 & 0x1f);
                                    psVar20->code_buffer = sVar15;
                                    psVar20->code_bits = uVar27;
                                  }
                                  bVar2 = psVar20->huff_ac[iVar16].values[uVar53];
                                  uVar47 = bVar2 & 0xf;
                                  bVar9 = bVar2 >> 4;
                                  uVar27 = (uint)bVar9;
                                  iVar30 = (int)paVar32;
                                  if ((bVar2 & 0xf) == 0) {
                                    if (bVar2 < 0xf0) {
                                      iVar51 = 1 << bVar9;
                                      psVar20->eob_run = iVar51;
                                      if (0xf < bVar2) {
                                        if (iVar30 < (int)uVar27) {
                                          stbi__grow_buffer_unsafe(psVar20);
                                          sVar15 = psVar20->code_buffer;
                                          iVar30 = psVar20->code_bits;
                                          iVar51 = psVar20->eob_run;
                                        }
                                        uVar17 = sVar15 << bVar9 | sVar15 >> 0x20 - bVar9;
                                        uVar47 = stbi__bmask[uVar27];
                                        psVar20->code_buffer = ~uVar47 & uVar17;
                                        iVar51 = iVar51 + (uVar17 & uVar47);
                                        psVar20->code_bits = iVar30 - uVar27;
                                      }
                                      goto LAB_0012277b;
                                    }
                                    uVar47 = iVar51 + 0x10;
                                  }
                                  else {
                                    lVar34 = (long)iVar51 + (ulong)uVar27;
                                    bVar2 = ""[lVar34];
                                    if (iVar30 < (int)uVar47) {
                                      stbi__grow_buffer_unsafe(psVar20);
                                      sVar15 = psVar20->code_buffer;
                                      iVar30 = psVar20->code_bits;
                                    }
                                    uVar17 = sVar15 << (sbyte)uVar47 |
                                             sVar15 >> 0x20 - (sbyte)uVar47;
                                    uVar27 = *(uint *)((long)stbi__bmask + (ulong)(uVar47 * 4));
                                    psVar20->code_buffer = ~uVar27 & uVar17;
                                    paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar30 - uVar47)
                                    ;
                                    psVar20->code_bits = iVar30 - uVar47;
                                    iVar51 = 0;
                                    if (-1 < (int)sVar15) {
                                      iVar51 = *(int *)((long)stbi__jbias + (ulong)(uVar47 * 4));
                                    }
                                    uVar47 = (int)lVar34 + 1;
                                    psVar44[bVar2] =
                                         (short)((uVar17 & uVar27) + iVar51 << (bVar13 & 0x1f));
                                  }
                                }
                                else {
                                  lVar34 = (long)iVar51 + (ulong)(uVar27 >> 4 & 0xf);
                                  psVar20->code_buffer = uVar47 << (sbyte)(uVar27 & 0xf);
                                  uVar47 = psVar20->code_bits - (uVar27 & 0xf);
                                  paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar47;
                                  psVar20->code_bits = uVar47;
                                  uVar47 = (int)lVar34 + 1;
                                  psVar44[""[lVar34]] = (short)((uVar27 >> 8) << (bVar13 & 0x1f));
                                }
                                uVar53 = (ulong)uVar47;
                              } while ((int)uVar47 <= psVar20->spec_end);
                            }
                            else {
LAB_0012277b:
                              psVar20->eob_run = iVar51 + -1;
                            }
                          }
                          else if (iVar51 == 0) {
                            iVar51 = 0x10000 << (bVar13 & 0x1f);
                            paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar20->code_bits;
                            do {
                              if ((int)paVar32 < 0x10) {
                                stbi__grow_buffer_unsafe(psVar20);
                              }
                              uVar47 = psVar20->code_buffer;
                              uVar43 = (ulong)psVar20->huff_ac[iVar16].fast[uVar47 >> 0x17];
                              if (uVar43 == 0xff) {
                                lVar34 = 0;
                                do {
                                  lVar28 = lVar34;
                                  lVar34 = lVar28 + 1;
                                } while (psVar20->huff_ac[iVar16].maxcode[lVar28 + 10] <=
                                         uVar47 >> 0x10);
                                uVar27 = psVar20->code_bits;
                                paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar27;
                                if (lVar34 == 8) goto LAB_00125516;
                                if ((int)uVar27 < (int)(lVar28 + 10)) goto LAB_00125520;
                                uVar43 = (ulong)(int)((uVar47 >> (0x17U - (char)lVar34 & 0x1f) &
                                                      stbi__bmask[lVar28 + 10]) +
                                                     psVar20->huff_ac[iVar16].delta[lVar28 + 10]);
                                bVar2 = psVar20->huff_ac[iVar16].size[uVar43];
                                if ((uVar47 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                    (uint)psVar20->huff_ac[iVar16].code[uVar43]) {
LAB_00125635:
                                  __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                                                ,0x7a1,
                                                "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                               );
                                }
                                uVar27 = (uVar27 - (int)lVar34) - 9;
                                paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar27;
                                psVar20->code_bits = uVar27;
                                sVar15 = uVar47 << ((byte)(lVar28 + 10) & 0x1f);
                                psVar20->code_buffer = sVar15;
                              }
                              else {
                                bVar2 = psVar20->huff_ac[iVar16].size[uVar43];
                                uVar27 = psVar20->code_bits - (uint)bVar2;
                                paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar27;
                                if (psVar20->code_bits < (int)(uint)bVar2) goto LAB_00125520;
                                sVar15 = uVar47 << (bVar2 & 0x1f);
                                psVar20->code_buffer = sVar15;
                                psVar20->code_bits = uVar27;
                              }
                              iVar30 = (int)paVar32;
                              bVar2 = psVar20->huff_ac[iVar16].values[uVar43];
                              bVar9 = bVar2 >> 4;
                              uVar47 = (uint)bVar9;
                              uVar43 = (ulong)uVar47;
                              if ((bVar2 & 0xf) == 1) {
                                if (iVar30 < 1) {
                                  stbi__grow_buffer_unsafe(psVar20);
                                  sVar15 = psVar20->code_buffer;
                                  iVar30 = psVar20->code_bits;
                                }
                                sVar42 = sVar15 * 2;
                                psVar20->code_buffer = sVar42;
                                paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar30 - 1U);
                                sVar39 = (short)(((int)~sVar15 >> 0x1f | 1U) << (bVar13 & 0x1f));
                                psVar20->code_bits = iVar30 - 1U;
                              }
                              else {
                                if ((bVar2 & 0xf) != 0) goto LAB_00125520;
                                if (bVar2 < 0xf0) {
                                  uVar27 = ~(-1 << bVar9);
                                  psVar20->eob_run = uVar27;
                                  uVar49 = 0x40;
                                  if (0xf < bVar2) {
                                    if (iVar30 < (int)uVar47) {
                                      stbi__grow_buffer_unsafe(psVar20);
                                      sVar15 = psVar20->code_buffer;
                                      iVar30 = psVar20->code_bits;
                                      uVar27 = psVar20->eob_run;
                                    }
                                    uVar40 = sVar15 << bVar9 | sVar15 >> 0x20 - bVar9;
                                    uVar17 = stbi__bmask[uVar43];
                                    sVar42 = ~uVar17 & uVar40;
                                    psVar20->code_buffer = sVar42;
                                    paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar30 - uVar47)
                                    ;
                                    psVar20->code_bits = iVar30 - uVar47;
                                    psVar20->eob_run = (uVar40 & uVar17) + uVar27;
                                    sVar39 = 0;
                                    uVar43 = uVar49;
                                    goto LAB_001229b2;
                                  }
                                }
                                else {
                                  uVar49 = 0xf;
                                }
                                sVar39 = 0;
                                uVar43 = uVar49;
                                sVar42 = sVar15;
                              }
LAB_001229b2:
                              uVar47 = psVar20->spec_end;
                              uVar49 = (ulong)uVar47;
                              if ((int)uVar53 <= (int)uVar47) {
                                uVar36 = (long)(int)uVar53;
                                do {
                                  uVar47 = (uint)uVar49;
                                  iVar30 = (int)paVar32;
                                  bVar2 = ""[uVar36];
                                  if (psVar44[bVar2] == 0) {
                                    if ((int)uVar43 == 0) {
                                      uVar53 = (ulong)((int)uVar36 + 1);
                                      psVar44[bVar2] = sVar39;
                                      break;
                                    }
                                    uVar43 = (ulong)((int)uVar43 - 1);
                                  }
                                  else {
                                    if (iVar30 < 1) {
                                      stbi__grow_buffer_unsafe(psVar20);
                                      sVar42 = psVar20->code_buffer;
                                      iVar30 = psVar20->code_bits;
                                    }
                                    sVar15 = sVar42 * 2;
                                    psVar20->code_buffer = sVar15;
                                    paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar30 - 1U);
                                    psVar20->code_bits = iVar30 - 1U;
                                    bVar55 = (int)sVar42 < 0;
                                    sVar42 = sVar15;
                                    if ((bVar55) &&
                                       (sVar4 = psVar44[bVar2], (iVar51 >> 0x10 & (int)sVar4) == 0))
                                    {
                                      sVar10 = (short)((uint)iVar51 >> 0x10);
                                      if (sVar4 < 1) {
                                        sVar10 = -sVar10;
                                      }
                                      psVar44[bVar2] = sVar4 + sVar10;
                                    }
                                  }
                                  uVar53 = uVar36 + 1;
                                  uVar47 = psVar20->spec_end;
                                  uVar49 = (ulong)(int)uVar47;
                                  bVar55 = (long)uVar36 < (long)uVar49;
                                  uVar36 = uVar53;
                                } while (bVar55);
                              }
                            } while ((int)uVar53 <= (int)uVar47);
                          }
                          else {
                            psVar20->eob_run = iVar51 + -1;
                            if (psVar20->spec_start <= psVar20->spec_end) {
                              uVar47 = (0x10000 << (bVar13 & 0x1f)) >> 0x10;
                              do {
                                bVar13 = ""[uVar53];
                                if (psVar44[bVar13] != 0) {
                                  iVar16 = psVar20->code_bits;
                                  if (iVar16 < 1) {
                                    stbi__grow_buffer_unsafe(psVar20);
                                    iVar16 = psVar20->code_bits;
                                  }
                                  sVar15 = psVar20->code_buffer;
                                  psVar20->code_buffer = sVar15 * 2;
                                  psVar20->code_bits = iVar16 + -1;
                                  if (((int)sVar15 < 0) &&
                                     (sVar39 = psVar44[bVar13], (uVar47 & (int)sVar39) == 0)) {
                                    uVar27 = -uVar47;
                                    if (0 < sVar39) {
                                      uVar27 = uVar47;
                                    }
                                    psVar44[bVar13] = (short)uVar27 + sVar39;
                                  }
                                }
                                bVar55 = (long)uVar53 < (long)psVar20->spec_end;
                                uVar53 = uVar53 + 1;
                              } while (bVar55);
                            }
                          }
                        }
                        iVar16 = psVar20->todo;
                        psVar20->todo = iVar16 + -1;
                        if (iVar16 < 2) {
                          if (psVar20->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar20);
                          }
                          bVar13 = psVar20->marker;
                          if ((bVar13 & 0xf8) != 0xd0) goto LAB_001233e6;
                          psVar20->code_buffer = 0;
                          psVar20->code_bits = 0;
                          psVar20->nomore = 0;
                          psVar20->img_comp[3].dc_pred = 0;
                          psVar20->img_comp[2].dc_pred = 0;
                          psVar20->img_comp[1].dc_pred = 0;
                          psVar20->img_comp[0].dc_pred = 0;
                          psVar20->marker = 0xff;
                          iVar16 = psVar20->restart_interval;
                          if (iVar16 == 0) {
                            iVar16 = 0x7fffffff;
                          }
                          psVar20->todo = iVar16;
                          psVar20->eob_run = 0;
                        }
                        iVar31 = iVar31 + 1;
                      } while (iVar31 != iVar19);
                    }
                    iVar45 = iVar45 + 1;
                  } while (iVar45 != iVar50);
                }
              }
              else {
                iVar14 = psVar20->img_mcu_y;
                if (0 < iVar14) {
                  iVar45 = psVar20->img_mcu_x;
                  iVar19 = 0;
                  do {
                    if (0 < iVar45) {
                      iVar14 = 0;
                      do {
                        iVar45 = psVar20->scan_n;
                        if (0 < iVar45) {
                          lVar34 = 0;
                          do {
                            iVar50 = psVar20->order[lVar34];
                            iVar31 = psVar20->img_comp[iVar50].v;
                            if (0 < iVar31) {
                              iVar45 = paVar1[iVar50].h;
                              iVar16 = 0;
                              do {
                                if (0 < iVar45) {
                                  iVar31 = 0;
                                  do {
                                    iVar45 = stbi__jpeg_decode_block_prog_dc
                                                       (psVar20,paVar1[iVar50].coeff +
                                                                (iVar45 * iVar14 + iVar31 +
                                                                (paVar1[iVar50].v * iVar19 + iVar16)
                                                                * paVar1[iVar50].coeff_w) * 0x40,
                                                        psVar20->huff_dc + paVar1[iVar50].hd,iVar50)
                                    ;
                                    uVar47 = extraout_EDX_04;
                                    if (iVar45 == 0) goto LAB_00123f50;
                                    iVar31 = iVar31 + 1;
                                    iVar45 = paVar1[iVar50].h;
                                  } while (iVar31 < iVar45);
                                  iVar31 = paVar1[iVar50].v;
                                }
                                iVar16 = iVar16 + 1;
                              } while (iVar16 < iVar31);
                              iVar45 = psVar20->scan_n;
                            }
                            lVar34 = lVar34 + 1;
                          } while (lVar34 < iVar45);
                          iVar50 = psVar20->todo;
                        }
                        psVar20->todo = iVar50 + -1;
                        bVar55 = iVar50 < 2;
                        iVar50 = iVar50 + -1;
                        if (bVar55) {
                          if (psVar20->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar20);
                          }
                          bVar13 = psVar20->marker;
                          if ((bVar13 & 0xf8) != 0xd0) goto LAB_001233e6;
                          psVar20->code_buffer = 0;
                          psVar20->code_bits = 0;
                          psVar20->nomore = 0;
                          psVar20->img_comp[3].dc_pred = 0;
                          psVar20->img_comp[2].dc_pred = 0;
                          psVar20->img_comp[1].dc_pred = 0;
                          psVar20->img_comp[0].dc_pred = 0;
                          psVar20->marker = 0xff;
                          iVar50 = psVar20->restart_interval;
                          if (iVar50 == 0) {
                            iVar50 = 0x7fffffff;
                          }
                          psVar20->todo = iVar50;
                          psVar20->eob_run = 0;
                        }
                        iVar14 = iVar14 + 1;
                        iVar45 = psVar20->img_mcu_x;
                      } while (iVar14 < iVar45);
                      iVar14 = psVar20->img_mcu_y;
                    }
                    iVar19 = iVar19 + 1;
                  } while (iVar19 < iVar14);
                }
              }
              bVar13 = psVar20->marker;
LAB_001233e6:
              if (bVar13 == 0xff) {
LAB_001233ee:
                do {
                  psVar41 = psVar20->s;
                  if ((psVar41->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012340e:
                    if (psVar41->img_buffer_end <= psVar41->img_buffer) goto LAB_001220f7;
                  }
                  else {
                    iVar14 = (*(psVar41->io).eof)(psVar41->io_user_data);
                    if (iVar14 != 0) {
                      if (psVar41->read_from_callbacks != 0) goto LAB_0012340e;
                      goto LAB_001220f7;
                    }
                  }
                  psVar41 = psVar20->s;
                  psVar35 = psVar41->img_buffer;
                  if (psVar35 < psVar41->img_buffer_end) {
                    psVar41->img_buffer = psVar35 + 1;
                    sVar12 = *psVar35;
                  }
                  else {
                    if (psVar41->read_from_callbacks == 0) goto LAB_001233ee;
                    psVar35 = psVar41->buffer_start;
                    iVar14 = (*(psVar41->io).read)
                                       (psVar41->io_user_data,(char *)psVar35,psVar41->buflen);
                    if (iVar14 == 0) {
                      psVar41->read_from_callbacks = 0;
                      psVar29 = psVar41->buffer_start + 1;
                      psVar41->buffer_start[0] = '\0';
                      sVar12 = '\0';
                    }
                    else {
                      psVar29 = psVar35 + iVar14;
                      sVar12 = *psVar35;
                    }
                    psVar41->img_buffer_end = psVar29;
                    psVar41->img_buffer = psVar41->buffer_start + 1;
                  }
                } while (sVar12 != 0xff);
                psVar41 = psVar20->s;
                psVar35 = psVar41->img_buffer;
                if (psVar35 < psVar41->img_buffer_end) {
                  psVar41->img_buffer = psVar35 + 1;
                  sVar12 = *psVar35;
                }
                else if (psVar41->read_from_callbacks == 0) {
                  sVar12 = '\0';
                }
                else {
                  psVar35 = psVar41->buffer_start;
                  iVar14 = (*(psVar41->io).read)
                                     (psVar41->io_user_data,(char *)psVar35,psVar41->buflen);
                  if (iVar14 == 0) {
                    psVar41->read_from_callbacks = 0;
                    psVar29 = psVar41->buffer_start + 1;
                    psVar41->buffer_start[0] = '\0';
                    sVar12 = '\0';
                  }
                  else {
                    psVar29 = psVar35 + iVar14;
                    sVar12 = *psVar35;
                  }
                  psVar41->img_buffer_end = psVar29;
                  psVar41->img_buffer = psVar41->buffer_start + 1;
                }
                psVar20->marker = sVar12;
              }
              goto LAB_001220f7;
            }
            stbi__g_failure_reason = "bad SOS";
            goto LAB_00123f49;
          }
        }
        else {
          if (psVar41->read_from_callbacks != 0) {
            psVar35 = psVar41->buffer_start;
            iVar50 = (*(psVar41->io).read)(psVar41->io_user_data,(char *)psVar35,psVar41->buflen);
            if (iVar50 == 0) {
              psVar41->read_from_callbacks = 0;
              psVar29 = psVar41->buffer_start + 1;
              psVar41->buffer_start[0] = '\0';
              bVar13 = 0;
            }
            else {
              psVar29 = psVar35 + iVar50;
              bVar13 = *psVar35;
            }
            psVar41->img_buffer_end = psVar29;
            psVar41->img_buffer = psVar41->buffer_start + 1;
            paVar32 = extraout_RDX_01;
            goto LAB_00122189;
          }
          psVar20->scan_n = 0;
        }
        stbi__g_failure_reason = "bad SOS component count";
        goto LAB_00123f49;
      }
LAB_00123f50:
      stbi__free_jpeg_components(psVar20,psVar20->s->img_n,uVar47);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_00123f5f:
    puVar26 = (uchar *)0x0;
LAB_00123f65:
    free(psVar20);
    return puVar26;
  }
  iVar14 = stbi__check_png_header(s);
  psVar29 = s->img_buffer_original;
  psVar35 = s->img_buffer_original_end;
  s->img_buffer = psVar29;
  s->img_buffer_end = psVar35;
  if (iVar14 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    local_528 = (undefined1  [8])s;
    iVar14 = stbi__parse_png_file((stbi__png *)local_528,0,req_comp);
    auVar11 = local_528;
    if (iVar14 == 0) {
      puVar26 = (uchar *)0x0;
    }
    else {
      iVar14 = 8;
      if (8 < (int)data._24_4_) {
        iVar14 = data._24_4_;
      }
      ri->bits_per_channel = iVar14;
      puVar26 = (uchar *)data._16_8_;
      if ((req_comp != 0) && (iVar14 = *(int *)((long)local_528 + 0xc), iVar14 != req_comp)) {
        uVar47 = *(stbi__uint32 *)local_528;
        uVar27 = *(stbi__uint32 *)((long)local_528 + 4);
        if ((int)data._24_4_ < 9) {
          puVar26 = stbi__convert_format((uchar *)data._16_8_,iVar14,req_comp,uVar47,uVar27);
        }
        else {
          puVar26 = (uchar *)malloc((ulong)(req_comp * uVar47 * uVar27 * 2));
          if (puVar26 == (uchar *)0x0) {
            free((void *)data._16_8_);
            stbi__g_failure_reason = "outofmem";
            *(int *)((long)auVar11 + 0xc) = req_comp;
            return (void *)0x0;
          }
          if (0 < (int)uVar27) {
            uVar17 = req_comp + iVar14 * 8;
            if ((0x23 < uVar17) || ((0xe161a1c00U >> ((ulong)uVar17 & 0x3f) & 1) == 0)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                            ,0x682,
                            "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                           );
            }
            iVar50 = uVar47 - 1;
            uVar53 = 0;
            uVar43 = 0;
            uVar49 = 0;
            do {
              lVar34 = data._16_8_ + uVar53 * 2;
              iVar45 = uVar47 * (int)uVar49;
              if (uVar17 - 10 < 0x19) {
                lVar28 = uVar43 * 2;
                puVar46 = (ushort *)(data._16_8_ + (ulong)(uint)(iVar45 * iVar14) * 2);
                switch(uVar17) {
                case 10:
                  if (-1 < iVar50) {
                    lVar28 = 0;
                    do {
                      *(undefined2 *)(puVar26 + lVar28 * 4 + uVar43 * 2) =
                           *(undefined2 *)(lVar34 + lVar28 * 2);
                      (puVar26 + lVar28 * 4 + uVar43 * 2 + 2)[0] = 0xff;
                      (puVar26 + lVar28 * 4 + uVar43 * 2 + 2)[1] = 0xff;
                      lVar28 = lVar28 + 1;
                    } while (uVar47 != (uint)lVar28);
                  }
                  break;
                case 0xb:
                  if (-1 < iVar50) {
                    puVar37 = puVar26 + uVar43 * 2 + 4;
                    lVar28 = 0;
                    do {
                      uVar6 = *(undefined2 *)(lVar34 + lVar28 * 2);
                      *(undefined2 *)puVar37 = uVar6;
                      *(undefined2 *)(puVar37 + -2) = uVar6;
                      *(undefined2 *)(puVar37 + -4) = uVar6;
                      lVar28 = lVar28 + 1;
                      puVar37 = puVar37 + 6;
                    } while (uVar47 != (uint)lVar28);
                  }
                  break;
                case 0xc:
                  if (-1 < iVar50) {
                    lVar33 = 0;
                    do {
                      uVar6 = *(undefined2 *)(lVar34 + lVar33 * 2);
                      *(undefined2 *)(puVar26 + lVar33 * 8 + lVar28 + 4) = uVar6;
                      *(undefined2 *)(puVar26 + lVar33 * 8 + lVar28 + 2) = uVar6;
                      *(undefined2 *)(puVar26 + lVar33 * 8 + lVar28) = uVar6;
                      (puVar26 + lVar33 * 8 + lVar28 + 6)[0] = 0xff;
                      (puVar26 + lVar33 * 8 + lVar28 + 6)[1] = 0xff;
                      lVar33 = lVar33 + 1;
                    } while (uVar47 != (uint)lVar33);
                  }
                  break;
                default:
                  goto switchD_0012375b_caseD_d;
                case 0x11:
                  if (-1 < iVar50) {
                    lVar28 = 0;
                    do {
                      *(undefined2 *)(puVar26 + lVar28 * 2 + uVar43 * 2) =
                           *(undefined2 *)(lVar34 + lVar28 * 4);
                      lVar28 = lVar28 + 1;
                    } while (uVar47 != (uint)lVar28);
                  }
                  break;
                case 0x13:
                  if (-1 < iVar50) {
                    puVar37 = puVar26 + uVar43 * 2 + 4;
                    lVar28 = 0;
                    do {
                      uVar6 = *(undefined2 *)(lVar34 + lVar28 * 4);
                      *(undefined2 *)puVar37 = uVar6;
                      *(undefined2 *)(puVar37 + -2) = uVar6;
                      *(undefined2 *)(puVar37 + -4) = uVar6;
                      lVar28 = lVar28 + 1;
                      puVar37 = puVar37 + 6;
                    } while (uVar47 != (uint)lVar28);
                  }
                  break;
                case 0x14:
                  if (-1 < iVar50) {
                    lVar33 = 0;
                    do {
                      uVar6 = *(undefined2 *)(lVar34 + lVar33 * 4);
                      *(undefined2 *)(puVar26 + lVar33 * 8 + lVar28 + 4) = uVar6;
                      *(undefined2 *)(puVar26 + lVar33 * 8 + lVar28 + 2) = uVar6;
                      *(undefined2 *)(puVar26 + lVar33 * 8 + lVar28) = uVar6;
                      *(undefined2 *)(puVar26 + lVar33 * 8 + lVar28 + 6) =
                           *(undefined2 *)(lVar34 + 2 + lVar33 * 4);
                      lVar33 = lVar33 + 1;
                    } while (uVar47 != (uint)lVar33);
                  }
                  break;
                case 0x19:
                  if (-1 < iVar50) {
                    lVar34 = 0;
                    do {
                      uVar5 = puVar46[2];
                      *(short *)(puVar26 + lVar34 * 2 + uVar43 * 2) =
                           (short)((uint)uVar5 * 2 + ((uint)uVar5 + (uint)uVar5 * 8) * 3 +
                                   (uint)puVar46[1] * 0x96 + (uint)*puVar46 * 0x4d >> 8);
                      lVar34 = lVar34 + 1;
                      puVar46 = puVar46 + 3;
                    } while (uVar47 != (uint)lVar34);
                  }
                  break;
                case 0x1a:
                  if (-1 < iVar50) {
                    lVar34 = 0;
                    do {
                      uVar5 = puVar46[2];
                      *(short *)(puVar26 + lVar34 * 4 + uVar43 * 2) =
                           (short)((uint)uVar5 * 2 + ((uint)uVar5 + (uint)uVar5 * 8) * 3 +
                                   (uint)puVar46[1] * 0x96 + (uint)*puVar46 * 0x4d >> 8);
                      (puVar26 + lVar34 * 4 + uVar43 * 2 + 2)[0] = 0xff;
                      (puVar26 + lVar34 * 4 + uVar43 * 2 + 2)[1] = 0xff;
                      lVar34 = lVar34 + 1;
                      puVar46 = puVar46 + 3;
                    } while (uVar47 != (uint)lVar34);
                  }
                  break;
                case 0x1c:
                  if (-1 < iVar50) {
                    lVar34 = 0;
                    do {
                      *(ushort *)(puVar26 + lVar34 * 8 + uVar43 * 2) = *puVar46;
                      *(ushort *)(puVar26 + lVar34 * 8 + uVar43 * 2 + 2) = puVar46[1];
                      *(ushort *)(puVar26 + lVar34 * 8 + uVar43 * 2 + 4) = puVar46[2];
                      (puVar26 + lVar34 * 8 + uVar43 * 2 + 6)[0] = 0xff;
                      (puVar26 + lVar34 * 8 + uVar43 * 2 + 6)[1] = 0xff;
                      lVar34 = lVar34 + 1;
                      puVar46 = puVar46 + 3;
                    } while (uVar47 != (uint)lVar34);
                  }
                  break;
                case 0x21:
                  if (-1 < iVar50) {
                    lVar28 = 0;
                    do {
                      uVar5 = *(ushort *)(lVar34 + 4 + lVar28 * 8);
                      *(short *)(puVar26 + lVar28 * 2 + uVar43 * 2) =
                           (short)((uint)uVar5 * 2 + ((uint)uVar5 + (uint)uVar5 * 8) * 3 +
                                   (uint)*(ushort *)(lVar34 + 2 + lVar28 * 8) * 0x96 +
                                   (uint)*(ushort *)(lVar34 + lVar28 * 8) * 0x4d >> 8);
                      lVar28 = lVar28 + 1;
                    } while (uVar47 != (uint)lVar28);
                  }
                  break;
                case 0x22:
                  if (-1 < iVar50) {
                    lVar28 = 0;
                    do {
                      uVar5 = *(ushort *)(lVar34 + 4 + lVar28 * 8);
                      *(short *)(puVar26 + lVar28 * 4 + uVar43 * 2) =
                           (short)((uint)uVar5 * 2 + ((uint)uVar5 + (uint)uVar5 * 8) * 3 +
                                   (uint)*(ushort *)(lVar34 + 2 + lVar28 * 8) * 0x96 +
                                   (uint)*(ushort *)(lVar34 + lVar28 * 8) * 0x4d >> 8);
                      *(undefined2 *)(puVar26 + lVar28 * 4 + uVar43 * 2 + 2) =
                           *(undefined2 *)(lVar34 + 6 + lVar28 * 8);
                      lVar28 = lVar28 + 1;
                    } while (uVar47 != (uint)lVar28);
                  }
                }
              }
              else {
switchD_0012375b_caseD_d:
                if (-1 < iVar50) {
                  puVar37 = puVar26 + (ulong)(uint)(iVar45 * req_comp) * 2;
                  lVar28 = 0;
                  do {
                    *(undefined2 *)puVar37 = *(undefined2 *)(lVar34 + lVar28 * 8);
                    *(undefined2 *)(puVar37 + 2) = *(undefined2 *)(lVar34 + 2 + lVar28 * 8);
                    *(undefined2 *)(puVar37 + 4) = *(undefined2 *)(lVar34 + 4 + lVar28 * 8);
                    lVar28 = lVar28 + 1;
                    puVar37 = puVar37 + 6;
                  } while (uVar47 != (uint)lVar28);
                }
              }
              uVar49 = uVar49 + 1;
              uVar43 = (ulong)((int)uVar43 + uVar47 * req_comp);
              uVar53 = (ulong)((int)uVar53 + iVar14 * uVar47);
            } while (uVar49 != uVar27);
          }
          free((void *)data._16_8_);
        }
        *(int *)((long)auVar11 + 0xc) = req_comp;
        if (puVar26 == (uchar *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(stbi__uint32 *)auVar11;
      *y = *(stbi__uint32 *)((long)auVar11 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)((long)auVar11 + 8);
      }
      data._16_8_ = (void *)0x0;
    }
    free((void *)data._16_8_);
    free((void *)data._8_8_);
    psVar20 = (stbi__jpeg *)data._0_8_;
    goto LAB_00123f65;
  }
  if (psVar29 < psVar35) {
    psVar22 = psVar29 + 1;
    s->img_buffer = psVar22;
    sVar12 = *psVar29;
LAB_0012362d:
    if (sVar12 == 'B') {
      if (psVar22 < psVar35) {
        s->img_buffer = psVar22 + 1;
        sVar12 = *psVar22;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_00123be2;
        psVar35 = s->buffer_start;
        iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
        if (iVar14 == 0) {
          s->read_from_callbacks = 0;
          psVar29 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar12 = '\0';
        }
        else {
          psVar29 = psVar35 + iVar14;
          sVar12 = *psVar35;
        }
        s->img_buffer_end = psVar29;
        s->img_buffer = s->buffer_start + 1;
      }
      if (sVar12 == 'M') {
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar47 = stbi__get16le(s);
        iVar14 = stbi__get16le(s);
        uVar47 = iVar14 << 0x10 | uVar47;
        if (((uVar47 < 0x39) && ((0x100010000001000U >> ((ulong)uVar47 & 0x3f) & 1) != 0)) ||
           (uVar47 == 0x6c)) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        else {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if (uVar47 != 0x7c) goto LAB_00123bf2;
        }
        coutput[2] = (stbi_uc *)CONCAT44(0xff,(uint)coutput[2]);
        pvVar24 = stbi__bmp_parse_header(s,(stbi__bmp_data *)auStack_e8);
        if (pvVar24 == (void *)0x0) {
          return (void *)0x0;
        }
        sVar15 = s->img_y;
        sVar42 = -sVar15;
        if (0 < (int)sVar15) {
          sVar42 = sVar15;
        }
        s->img_y = sVar42;
        uVar47 = (uint)coutput[2];
        if ((int)coutput[0] == 0xc) {
          if (0x17 < (int)auStack_e8._0_4_) goto LAB_00123c2b;
          uVar27 = (auStack_e8._4_4_ + -0x26) / 3;
LAB_00123c20:
          local_60 = (ulong)uVar27;
LAB_00123c57:
          bVar55 = (uint)coutput[2] == 0xff000000;
          iVar14 = 4 - (uint)((uint)coutput[2] == 0);
          local_78 = auStack_e8._0_4_;
        }
        else {
          if ((int)auStack_e8._0_4_ < 0x10) {
            uVar27 = (auStack_e8._4_4_ - (int)coutput[0]) + -0xe >> 2;
            goto LAB_00123c20;
          }
LAB_00123c2b:
          local_60 = 0;
          if (auStack_e8._0_4_ != 0x18 || (uint)coutput[2] != 0xff000000) goto LAB_00123c57;
          iVar14 = 3;
          local_78 = 0x18;
          bVar55 = true;
        }
        local_48 = coutput[2]._4_4_;
        s->img_n = iVar14;
        if (2 < req_comp) {
          iVar14 = req_comp;
        }
        sVar48 = s->img_x;
        iVar50 = stbi__mad3sizes_valid(iVar14,sVar48,sVar42,0);
        if (iVar50 == 0) {
          stbi__g_failure_reason = "too large";
          return (void *)0x0;
        }
        puVar26 = (uchar *)stbi__malloc_mad3(iVar14,sVar48,sVar42,0);
        if (puVar26 == (uchar *)0x0) {
          stbi__g_failure_reason = "outofmem";
          return (void *)0x0;
        }
        if (local_78 < 0x10) {
          iVar50 = (int)local_60;
          if (0x100 < iVar50 || iVar50 == 0) {
            free(puVar26);
            stbi__g_failure_reason = "invalid";
            return (void *)0x0;
          }
          if (0 < iVar50) {
            psVar35 = s->buffer_start;
            psVar29 = s->buffer_start + 1;
            psVar22 = s->img_buffer;
            psVar23 = s->img_buffer_end;
            uVar53 = 0;
            do {
              if (psVar22 < psVar23) {
                s->img_buffer = psVar22 + 1;
                sVar12 = *psVar22;
                psVar22 = psVar22 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                sVar12 = '\0';
              }
              else {
                iVar45 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                if (iVar45 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  sVar12 = '\0';
                  psVar23 = psVar29;
                }
                else {
                  sVar12 = *psVar35;
                  psVar23 = psVar35 + iVar45;
                }
                s->img_buffer_end = psVar23;
                s->img_buffer = psVar29;
                psVar22 = psVar29;
              }
              *(stbi_uc *)(data + uVar53 * 2 + -3) = sVar12;
              if (psVar22 < psVar23) {
                s->img_buffer = psVar22 + 1;
                sVar12 = *psVar22;
                psVar22 = psVar22 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                sVar12 = '\0';
              }
              else {
                iVar45 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                if (iVar45 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  sVar12 = '\0';
                  psVar23 = psVar29;
                }
                else {
                  sVar12 = *psVar35;
                  psVar23 = psVar35 + iVar45;
                }
                s->img_buffer_end = psVar23;
                s->img_buffer = psVar29;
                psVar22 = psVar29;
              }
              *(stbi_uc *)((long)data + uVar53 * 4 + -7) = sVar12;
              if (psVar22 < psVar23) {
                s->img_buffer = psVar22 + 1;
                sVar12 = *psVar22;
                psVar22 = psVar22 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                sVar12 = '\0';
              }
              else {
                iVar45 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                if (iVar45 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  sVar12 = '\0';
                  psVar23 = psVar29;
                }
                else {
                  sVar12 = *psVar35;
                  psVar23 = psVar35 + iVar45;
                }
                s->img_buffer_end = psVar23;
                s->img_buffer = psVar29;
                psVar22 = psVar29;
              }
              *(stbi_uc *)(data + uVar53 * 2 + -4) = sVar12;
              if ((int)coutput[0] != 0xc) {
                if (psVar22 < psVar23) {
                  psVar22 = psVar22 + 1;
                }
                else {
                  if (s->read_from_callbacks == 0) goto LAB_0012414a;
                  iVar45 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                  if (iVar45 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    psVar23 = psVar29;
                  }
                  else {
                    psVar23 = psVar35 + iVar45;
                  }
                  s->img_buffer_end = psVar23;
                  psVar22 = psVar29;
                }
                s->img_buffer = psVar22;
              }
LAB_0012414a:
              *(undefined1 *)((long)data + uVar53 * 4 + -5) = 0xff;
              uVar53 = uVar53 + 1;
            } while (local_60 != uVar53);
          }
          stbi__skip(s,(iVar50 * ((int)coutput[0] == 0xc | 0xfffffffc) - (int)coutput[0]) +
                       auStack_e8._4_4_ + -0xe);
          if (local_78 == 1) {
            sVar42 = s->img_y;
            if (0 < (int)sVar42) {
              local_60._0_4_ = -(s->img_x + 7 >> 3) & 3;
              psVar35 = s->buffer_start;
              psVar29 = s->buffer_start + 1;
              iVar45 = 0;
              iVar50 = 0;
              do {
                psVar22 = s->img_buffer;
                psVar23 = s->img_buffer_end;
                if (psVar22 < psVar23) {
                  s->img_buffer = psVar22 + 1;
                  bVar13 = *psVar22;
                  psVar22 = psVar22 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar13 = 0;
                }
                else {
                  iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                  if (iVar19 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar13 = 0;
                    psVar23 = psVar29;
                  }
                  else {
                    bVar13 = *psVar35;
                    psVar23 = psVar35 + iVar19;
                  }
                  s->img_buffer_end = psVar23;
                  s->img_buffer = psVar29;
                  psVar22 = psVar29;
                }
                sVar42 = s->img_x;
                if (0 < (int)sVar42) {
                  uVar47 = (uint)bVar13;
                  sVar48 = 0;
                  uVar27 = 7;
                  do {
                    uVar43 = (ulong)((uVar47 >> (uVar27 & 0x1f) & 1) != 0);
                    lVar34 = (long)iVar45;
                    uVar53 = lVar34 + 3;
                    puVar26[lVar34] = (uchar)data[uVar43 * 2 + -4];
                    puVar26[lVar34 + 1] = *(uchar *)((long)data + uVar43 * 4 + -7);
                    puVar26[lVar34 + 2] = (uchar)data[uVar43 * 2 + -3];
                    if (iVar14 == 4) {
                      puVar26[uVar53] = 0xff;
                      uVar53 = (ulong)(iVar45 + 4);
                    }
                    iVar45 = (int)uVar53;
                    sVar48 = sVar48 + 1;
                    if (sVar48 == sVar42) break;
                    if ((int)uVar27 < 1) {
                      if (psVar22 < psVar23) {
                        s->img_buffer = psVar22 + 1;
                        uVar47 = (uint)*psVar22;
                        psVar22 = psVar22 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        uVar47 = 0;
                      }
                      else {
                        iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                        if (iVar19 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          uVar47 = 0;
                          psVar23 = psVar29;
                        }
                        else {
                          uVar47 = (uint)*psVar35;
                          psVar23 = psVar35 + iVar19;
                        }
                        s->img_buffer_end = psVar23;
                        s->img_buffer = psVar29;
                        sVar42 = s->img_x;
                        psVar22 = psVar29;
                      }
                      uVar27 = 7;
                    }
                    else {
                      uVar27 = uVar27 - 1;
                    }
                  } while ((int)sVar48 < (int)sVar42);
                }
                stbi__skip(s,(uint)local_60);
                iVar50 = iVar50 + 1;
                sVar42 = s->img_y;
              } while (iVar50 < (int)sVar42);
            }
          }
          else {
            if (local_78 == 8) {
              uVar47 = s->img_x;
            }
            else {
              if (local_78 != 4) {
                free(puVar26);
                stbi__g_failure_reason = "bad bpp";
                return (void *)0x0;
              }
              uVar47 = s->img_x + 1 >> 1;
            }
            sVar42 = s->img_y;
            if (0 < (int)sVar42) {
              local_50 = -uVar47 & 3;
              psVar35 = s->buffer_start;
              psVar29 = s->buffer_start + 1;
              uVar53 = 0;
              iVar50 = 0;
              do {
                if (0 < (int)s->img_x) {
                  psVar22 = s->img_buffer;
                  psVar23 = s->img_buffer_end;
                  iVar45 = 0;
                  do {
                    if (psVar22 < psVar23) {
                      s->img_buffer = psVar22 + 1;
                      bVar13 = *psVar22;
                      psVar22 = psVar22 + 1;
                    }
                    else if (s->read_from_callbacks == 0) {
                      bVar13 = 0;
                    }
                    else {
                      iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                      if (iVar19 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar13 = 0;
                        psVar23 = psVar29;
                      }
                      else {
                        bVar13 = *psVar35;
                        psVar23 = psVar35 + iVar19;
                      }
                      s->img_buffer_end = psVar23;
                      s->img_buffer = psVar29;
                      psVar22 = psVar29;
                    }
                    uVar47 = (uint)(bVar13 >> 4);
                    if (local_78 != 4) {
                      uVar47 = (uint)bVar13;
                    }
                    uVar43 = (ulong)uVar47;
                    uVar47 = bVar13 & 0xf;
                    if (local_78 != 4) {
                      uVar47 = 0;
                    }
                    lVar34 = (long)(int)uVar53;
                    uVar49 = lVar34 + 3;
                    puVar26[lVar34] = (uchar)data[uVar43 * 2 + -4];
                    puVar26[lVar34 + 1] = *(uchar *)((long)data + uVar43 * 4 + -7);
                    puVar26[lVar34 + 2] = (uchar)data[uVar43 * 2 + -3];
                    if (iVar14 == 4) {
                      puVar26[uVar49] = 0xff;
                      uVar49 = (ulong)((int)uVar53 + 4);
                    }
                    if (iVar45 + 1U == s->img_x) {
                      uVar53 = uVar49 & 0xffffffff;
                      break;
                    }
                    if (local_78 == 8) {
                      if (psVar22 < psVar23) {
                        s->img_buffer = psVar22 + 1;
                        bVar13 = *psVar22;
                        psVar22 = psVar22 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar13 = 0;
                      }
                      else {
                        iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                        if (iVar19 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar13 = 0;
                          psVar23 = psVar29;
                        }
                        else {
                          bVar13 = *psVar35;
                          psVar23 = psVar35 + iVar19;
                        }
                        s->img_buffer_end = psVar23;
                        s->img_buffer = psVar29;
                        psVar22 = psVar29;
                      }
                      uVar47 = (uint)bVar13;
                    }
                    lVar34 = (long)(int)uVar49;
                    uVar53 = lVar34 + 3;
                    uVar43 = (ulong)uVar47;
                    puVar26[lVar34] = (uchar)data[uVar43 * 2 + -4];
                    puVar26[lVar34 + 1] = *(uchar *)((long)data + uVar43 * 4 + -7);
                    puVar26[lVar34 + 2] = (uchar)data[uVar43 * 2 + -3];
                    if (iVar14 == 4) {
                      puVar26[uVar53] = 0xff;
                      uVar53 = (ulong)((int)uVar49 + 4);
                    }
                    iVar45 = iVar45 + 2;
                  } while (iVar45 < (int)s->img_x);
                }
                stbi__skip(s,local_50);
                iVar50 = iVar50 + 1;
                sVar42 = s->img_y;
              } while (iVar50 < (int)sVar42);
            }
          }
          goto LAB_00125530;
        }
        stbi__skip(s,(auStack_e8._4_4_ - (int)coutput[0]) + -0xe);
        if (local_78 == 0x10) {
          local_bc = s->img_x * 2 & 2;
LAB_0012426d:
          if (coutput[1]._4_4_ == 0 || ((uint)coutput[1] == 0 || coutput[0]._4_4_ == 0)) {
            free(puVar26);
            stbi__g_failure_reason = "bad masks";
            return (void *)0x0;
          }
          iVar50 = stbi__high_bit(coutput[0]._4_4_);
          iVar50 = iVar50 + -7;
          uVar27 = (coutput[0]._4_4_ >> 1 & 0x55555555) + (coutput[0]._4_4_ & 0x55555555);
          uVar27 = (uVar27 >> 2 & 0x33333333) + (uVar27 & 0x33333333);
          uVar27 = (uVar27 >> 4) + uVar27 & 0xf0f0f0f;
          uVar27 = (uVar27 >> 8) + uVar27;
          uVar27 = (uVar27 >> 0x10) + uVar27 & 0xff;
          iVar45 = stbi__high_bit((uint)coutput[1]);
          iVar45 = iVar45 + -7;
          uVar17 = ((uint)coutput[1] >> 1 & 0x55555555) + ((uint)coutput[1] & 0x55555555);
          uVar17 = (uVar17 >> 2 & 0x33333333) + (uVar17 & 0x33333333);
          uVar17 = (uVar17 >> 4) + uVar17 & 0xf0f0f0f;
          uVar17 = (uVar17 >> 8) + uVar17;
          uVar17 = (uVar17 >> 0x10) + uVar17 & 0xff;
          local_9c = stbi__high_bit(coutput[1]._4_4_);
          local_9c = local_9c + -7;
          uVar40 = (coutput[1]._4_4_ >> 1 & 0x55555555) + (coutput[1]._4_4_ & 0x55555555);
          uVar40 = (uVar40 >> 2 & 0x33333333) + (uVar40 & 0x33333333);
          uVar40 = (uVar40 >> 4) + uVar40 & 0xf0f0f0f;
          uVar40 = (uVar40 >> 8) + uVar40;
          uVar40 = (uVar40 >> 0x10) + uVar40 & 0xff;
          local_f4 = stbi__high_bit(uVar47);
          local_f4 = local_f4 + -7;
          uVar18 = (uVar47 >> 1 & 0x55555555) + (uVar47 & 0x55555555);
          uVar18 = (uVar18 >> 2 & 0x33333333) + (uVar18 & 0x33333333);
          uVar18 = (uVar18 >> 4) + uVar18 & 0xf0f0f0f;
          uVar18 = (uVar18 >> 8) + uVar18;
          local_f0 = (uVar18 >> 0x10) + uVar18 & 0xff;
          bVar8 = true;
          bVar55 = false;
        }
        else {
          if (local_78 == 0x20) {
            local_bc = 0;
            if (!(bool)((coutput[0]._4_4_ == 0xff0000 &&
                        ((uint)coutput[1] == 0xff00 && coutput[1]._4_4_ == 0xff)) & bVar55))
            goto LAB_0012426d;
            bVar55 = true;
          }
          else {
            local_bc = 0;
            if (local_78 != 0x18) goto LAB_0012426d;
            local_bc = s->img_x & 3;
            bVar55 = false;
          }
          bVar8 = false;
          iVar50 = 0;
          iVar45 = 0;
          local_9c = 0;
          local_f4 = 0;
          uVar27 = 0;
          uVar17 = 0;
          uVar40 = 0;
          local_f0 = 0;
        }
        sVar42 = s->img_y;
        if (0 < (int)sVar42) {
          psVar35 = s->buffer_start;
          psVar29 = s->buffer_start + 1;
          iVar31 = 0;
          iVar19 = 0;
          do {
            if (bVar8) {
              if (0 < (int)s->img_x) {
                iVar16 = 0;
                do {
                  uVar18 = stbi__get16le(s);
                  if (local_78 != 0x10) {
                    iVar51 = stbi__get16le(s);
                    uVar18 = uVar18 | iVar51 << 0x10;
                  }
                  iVar51 = stbi__shiftsigned(uVar18 & coutput[0]._4_4_,iVar50,uVar27);
                  lVar34 = (long)iVar31;
                  puVar26[lVar34] = (uchar)iVar51;
                  iVar51 = stbi__shiftsigned(uVar18 & (uint)coutput[1],iVar45,uVar17);
                  puVar26[lVar34 + 1] = (uchar)iVar51;
                  iVar51 = stbi__shiftsigned(uVar18 & coutput[1]._4_4_,local_9c,uVar40);
                  puVar26[lVar34 + 2] = (uchar)iVar51;
                  if (uVar47 == 0) {
                    uVar18 = 0xff;
                  }
                  else {
                    uVar18 = stbi__shiftsigned(uVar18 & uVar47,local_f4,local_f0);
                  }
                  uVar53 = lVar34 + 3;
                  if (iVar14 == 4) {
                    puVar26[uVar53] = (uchar)uVar18;
                    uVar53 = (ulong)(iVar31 + 4);
                  }
                  local_48 = local_48 | uVar18;
                  iVar16 = iVar16 + 1;
                  iVar31 = (int)uVar53;
                } while (iVar16 < (int)s->img_x);
              }
            }
            else if (0 < (int)s->img_x) {
              psVar22 = s->img_buffer;
              psVar23 = s->img_buffer_end;
              iVar16 = 0;
              do {
                if (psVar22 < psVar23) {
                  s->img_buffer = psVar22 + 1;
                  bVar13 = *psVar22;
                  psVar22 = psVar22 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar13 = 0;
                }
                else {
                  iVar51 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                  if (iVar51 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar13 = 0;
                    psVar23 = psVar29;
                  }
                  else {
                    bVar13 = *psVar35;
                    psVar23 = psVar35 + iVar51;
                  }
                  s->img_buffer_end = psVar23;
                  s->img_buffer = psVar29;
                  psVar22 = psVar29;
                }
                lVar34 = (long)iVar31;
                puVar26[lVar34 + 2] = bVar13;
                if (psVar22 < psVar23) {
                  s->img_buffer = psVar22 + 1;
                  bVar13 = *psVar22;
                  psVar22 = psVar22 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar13 = 0;
                }
                else {
                  iVar51 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                  if (iVar51 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar13 = 0;
                    psVar23 = psVar29;
                  }
                  else {
                    bVar13 = *psVar35;
                    psVar23 = psVar35 + iVar51;
                  }
                  s->img_buffer_end = psVar23;
                  s->img_buffer = psVar29;
                  psVar22 = psVar29;
                }
                puVar26[lVar34 + 1] = bVar13;
                if (psVar22 < psVar23) {
                  s->img_buffer = psVar22 + 1;
                  bVar13 = *psVar22;
                  psVar22 = psVar22 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar13 = 0;
                }
                else {
                  iVar51 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                  if (iVar51 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar13 = 0;
                    psVar23 = psVar29;
                  }
                  else {
                    bVar13 = *psVar35;
                    psVar23 = psVar35 + iVar51;
                  }
                  s->img_buffer_end = psVar23;
                  s->img_buffer = psVar29;
                  psVar22 = psVar29;
                }
                puVar26[lVar34] = bVar13;
                bVar13 = 0xff;
                if (bVar55) {
                  if (psVar22 < psVar23) {
                    s->img_buffer = psVar22 + 1;
                    bVar13 = *psVar22;
                    psVar22 = psVar22 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar13 = 0;
                  }
                  else {
                    iVar51 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                    if (iVar51 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar13 = 0;
                      psVar23 = psVar29;
                    }
                    else {
                      bVar13 = *psVar35;
                      psVar23 = psVar35 + iVar51;
                    }
                    s->img_buffer_end = psVar23;
                    s->img_buffer = psVar29;
                    psVar22 = psVar29;
                  }
                }
                uVar53 = lVar34 + 3;
                if (iVar14 == 4) {
                  puVar26[uVar53] = bVar13;
                  uVar53 = (ulong)(iVar31 + 4);
                }
                local_48 = local_48 | bVar13;
                iVar16 = iVar16 + 1;
                iVar31 = (int)uVar53;
              } while (iVar16 < (int)s->img_x);
            }
            stbi__skip(s,local_bc);
            iVar19 = iVar19 + 1;
            sVar42 = s->img_y;
          } while (iVar19 < (int)sVar42);
        }
LAB_00125530:
        if (((iVar14 == 4) && (local_48 == 0)) && (iVar50 = s->img_x * sVar42 * 4, -1 < iVar50 + -1)
           ) {
          uVar53 = (ulong)(iVar50 - 4) + 7;
          do {
            puVar26[uVar53 - 4] = 0xff;
            uVar53 = uVar53 - 4;
          } while (3 < uVar53);
        }
        if ((int)sVar15 < 1) {
          uVar47 = s->img_x;
        }
        else {
          uVar47 = s->img_x;
          if (0 < (int)sVar42 >> 1) {
            uVar27 = uVar47 * iVar14;
            uVar17 = (sVar42 - 1) * uVar27;
            uVar53 = 0;
            uVar43 = 0;
            do {
              if (0 < (int)uVar27) {
                uVar49 = 0;
                do {
                  uVar3 = puVar26[uVar49 + uVar53];
                  puVar26[uVar49 + uVar53] = puVar26[uVar49 + uVar17];
                  puVar26[uVar49 + uVar17] = uVar3;
                  uVar49 = uVar49 + 1;
                } while (uVar27 != uVar49);
              }
              uVar43 = uVar43 + 1;
              uVar17 = uVar17 - uVar27;
              uVar53 = (ulong)((int)uVar53 + uVar27);
            } while (uVar43 != (uint)((int)sVar42 >> 1));
          }
        }
        if ((req_comp != 0) && (iVar14 != req_comp)) {
          puVar26 = stbi__convert_format(puVar26,iVar14,req_comp,uVar47,sVar42);
          if (puVar26 == (uchar *)0x0) {
            return (void *)0x0;
          }
          uVar47 = s->img_x;
        }
        *x = uVar47;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return puVar26;
        }
        return puVar26;
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    psVar29 = s->buffer_start;
    iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar29,s->buflen);
    if (iVar14 == 0) {
      s->read_from_callbacks = 0;
      psVar35 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar12 = '\0';
    }
    else {
      psVar35 = psVar29 + iVar14;
      sVar12 = *psVar29;
    }
    s->img_buffer_end = psVar35;
    psVar22 = s->buffer_start + 1;
    s->img_buffer = psVar22;
    goto LAB_0012362d;
  }
LAB_00123be2:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
LAB_00123bf2:
  stbi__g_failure_reason = "unknown image type";
  return (void *)0x0;
LAB_00125516:
  paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar27 - 0x10);
  psVar20->code_bits = uVar27 - 0x10;
LAB_00125520:
  stbi__g_failure_reason = "bad huffman code";
LAB_00123f49:
  uVar47 = (uint)paVar32;
  goto LAB_00123f50;
LAB_001220f7:
  bVar13 = stbi__get_marker(psVar20);
  goto LAB_001220a1;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}